

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::drawOneIteration
          (MultisampleRenderCase *this)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  ShaderProgram *pSVar9;
  ProgramSources *pPVar10;
  TestError *pTVar11;
  MessageBuilder *pMVar12;
  undefined8 uVar13;
  pointer ppVar14;
  reference pvVar15;
  PixelBufferAccess local_15f8;
  int local_15cc;
  undefined1 local_15c8 [4];
  int sampleNdx_1;
  int local_1448;
  undefined1 local_1442;
  allocator<char> local_1441;
  int sampleNdx;
  undefined1 local_141a;
  allocator<char> local_1419;
  string local_1418;
  MessageBuilder local_13f8;
  MessageBuilder local_1278;
  allocator<tcu::Surface> local_10f1;
  undefined1 local_10f0 [8];
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> resultBuffers;
  deUint32 textureTarget_1;
  deInt32 sampleLocation;
  deInt32 samplerLocation_1;
  deInt32 posLocation_1;
  MessageBuilder local_10a0;
  undefined1 local_f1a;
  allocator<char> local_f19;
  string local_f18;
  MessageBuilder local_ef8;
  MessageBuilder local_d78;
  undefined1 local_bf8 [8];
  Surface resultImage_2;
  deUint32 textureTarget;
  deInt32 samplerLocation;
  deInt32 posLocation;
  MessageBuilder local_ba8;
  MessageBuilder local_a28;
  undefined1 local_8a8 [8];
  Surface resultImage_1;
  MessageBuilder local_868;
  undefined1 local_6e8 [8];
  Surface resultImage;
  iterator iStack_6c8;
  deInt32 location;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
  local_6c0;
  iterator local_6b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
  local_6b0;
  const_iterator it;
  MessageBuilder local_528;
  undefined1 local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  LogSection local_330;
  undefined1 local_2e9;
  string local_2e8;
  ShaderSource local_2c8;
  string local_2a0;
  ShaderSource local_280;
  ProgramSources local_258;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ScopedLogSection local_148;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  byte local_113;
  byte local_112;
  byte local_111;
  string local_110;
  byte local_ee;
  byte local_ed;
  byte local_dd;
  int local_dc;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string sectionDescription;
  Functions *gl;
  MultisampleRenderCase *this_local;
  
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  sectionDescription.field_2._8_8_ = CONCAT44(extraout_var,iVar4);
  local_dd = 0;
  local_ed = 0;
  local_ee = 0;
  local_111 = 0;
  local_112 = 0;
  local_113 = 0;
  section.m_log._7_1_ = 0;
  section.m_log._5_1_ = 0;
  if (this->m_numIterations < 2) {
    std::allocator<char>::allocator();
    section.m_log._5_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"Test",(allocator<char> *)((long)&section.m_log + 6));
  }
  else {
    local_dc = this->m_iteration + 1;
    de::toString<int>(&local_d8,&local_dc);
    local_dd = 1;
    std::operator+(&local_b8,"Iteration ",&local_d8);
    local_ed = 1;
    std::operator+(&local_98,&local_b8,"/");
    local_ee = 1;
    de::toString<int>(&local_110,&this->m_numIterations);
    local_111 = 1;
    std::operator+(&local_78,&local_98,&local_110);
    local_112 = 1;
    std::operator+(&local_58,&local_78,": ");
    local_113 = 1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
              (&local_138,this,(ulong)(uint)this->m_iteration);
    section.m_log._7_1_ = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,&local_138);
  }
  if ((section.m_log._5_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 6));
  }
  if ((section.m_log._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_138);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_112 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_111 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((local_ee & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_ed & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_dd & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  de::toString<int>(&local_188,&this->m_iteration);
  std::operator+(&local_168,"Iteration",&local_188);
  tcu::ScopedLogSection::ScopedLogSection(&local_148,pTVar8,&local_168,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  if ((this->m_perIterationShader & 1U) != 0) {
    pSVar9 = this->m_program;
    if (pSVar9 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar9);
      operator_delete(pSVar9,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    pSVar9 = (ShaderProgram *)operator_new(0xd0);
    local_2e9 = 1;
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_258);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_2a0,this,(ulong)(uint)this->m_numTargetSamples);
    glu::VertexSource::VertexSource((VertexSource *)&local_280,&local_2a0);
    pPVar10 = glu::ProgramSources::operator<<(&local_258,&local_280);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_2e8,this,(ulong)(uint)this->m_numTargetSamples);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_2c8,&local_2e8);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_2c8);
    glu::ShaderProgram::ShaderProgram(pSVar9,pRVar7,pPVar10);
    local_2e9 = 0;
    this->m_program = pSVar9;
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    glu::VertexSource::~VertexSource((VertexSource *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    glu::ProgramSources::~ProgramSources(&local_258);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"RenderShader",&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Render shader",&local_379);
    tcu::LogSection::LogSection(&local_330,&local_350,&local_378);
    pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_330);
    pTVar8 = glu::operator<<(pTVar8,this->m_program);
    tcu::TestLog::operator<<(pTVar8,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::LogSection::~LogSection(&local_330);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    bVar3 = glu::ShaderProgram::isOk(this->m_program);
    if (!bVar3) {
      local_3a2 = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"could not build program",&local_3a1);
      tcu::TestError::TestError(pTVar11,&local_3a0);
      local_3a2 = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  if ((this->m_renderTarget == TARGET_TEXTURE) || (this->m_renderTarget == TARGET_RENDERBUFFER)) {
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,this->m_fbo);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"bind fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x1dc);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_528,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<(&local_528,(char (*) [11])"Rendering ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_renderSceneDescription);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [28])" with render shader to fbo.");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_528);
  }
  else {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&it,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)&it,(char (*) [11])"Rendering ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_renderSceneDescription);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (pMVar12,(char (*) [44])" with render shader to default framebuffer.");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&it);
  }
  (**(code **)(sectionDescription.field_2._8_8_ + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(sectionDescription.field_2._8_8_ + 0x188))(0x4000);
  (**(code **)(sectionDescription.field_2._8_8_ + 0x1a00))(0,0,this->m_renderSize);
  dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1e6);
  (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(this->m_renderVao);
  (**(code **)(sectionDescription.field_2._8_8_ + 0x40))(0x8892,this->m_buffer);
  local_6b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
       ::begin(&this->m_renderAttribs);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
  ::_Rb_tree_const_iterator(&local_6b0,&local_6b8);
  while( true ) {
    iStack_6c8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
                 ::end(&this->m_renderAttribs);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
    ::_Rb_tree_const_iterator(&local_6c0,&stack0xfffffffffffff938);
    bVar3 = std::operator!=(&local_6b0,&local_6c0);
    if (!bVar3) break;
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_program);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
    ::operator->(&local_6b0);
    uVar13 = std::__cxx11::string::c_str();
    iVar4 = (*pcVar2)(dVar5,uVar13);
    resultImage.m_pixels.m_cap._4_4_ = iVar4;
    if (iVar4 != -1) {
      pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x19f0);
      ppVar14 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
                ::operator->(&local_6b0);
      iVar1 = (ppVar14->second).stride;
      ppVar14 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
                ::operator->(&local_6b0);
      (*pcVar2)(iVar4,4,0x1406,0,iVar1,(ppVar14->second).offset);
      (**(code **)(sectionDescription.field_2._8_8_ + 0x610))(resultImage.m_pixels.m_cap._4_4_);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>
    ::operator++(&local_6b0);
  }
  dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"set attrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1f7);
  pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar5);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  (**(code **)(sectionDescription.field_2._8_8_ + 0x538))(this->m_renderMode,0,this->m_renderCount);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  (**(code **)(sectionDescription.field_2._8_8_ + 0x1680))(0);
  (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(0);
  dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
  glu::checkError(dVar5,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1ff);
  if ((this->m_renderTarget == TARGET_TEXTURE) || (this->m_renderTarget == TARGET_RENDERBUFFER)) {
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,0);
  }
  if (this->m_renderTarget == TARGET_DEFAULT) {
    tcu::Surface::Surface((Surface *)local_6e8,this->m_renderSize,this->m_renderSize);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_868,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_868,(char (*) [41])"Reading pixels from default framebuffer.");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_868);
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)&resultImage_1.m_pixels.m_cap,(Surface *)local_6e8)
    ;
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)&resultImage_1.m_pixels.m_cap);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x20f);
    verifyResultImageAndSetResult(this,(Surface *)local_6e8);
    tcu::Surface::~Surface((Surface *)local_6e8);
  }
  else if (this->m_renderTarget == TARGET_RENDERBUFFER) {
    tcu::Surface::Surface((Surface *)local_8a8,this->m_renderSize,this->m_renderSize);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_a28,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_a28,
                         (char (*) [69])
                         "Blitting result from fbo to single sample fbo. (Resolve multisample)");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a28);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8ca8,this->m_fbo);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8ca9,this->m_resolveFbo);
    iVar4 = this->m_renderSize;
    (**(code **)(sectionDescription.field_2._8_8_ + 0x140))
              (0,0,iVar4,iVar4,0,0,iVar4,iVar4,0x4000,0x2600);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"blit resolve",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x21f);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_ba8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_ba8,(char (*) [47])"Reading pixels from single sample framebuffer.")
    ;
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_ba8);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8ca8,this->m_resolveFbo);
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)&samplerLocation,(Surface *)local_8a8);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)&samplerLocation);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x225);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,(Surface *)local_8a8);
    tcu::Surface::~Surface((Surface *)local_8a8);
  }
  else if ((this->m_renderTarget == TARGET_TEXTURE) &&
          ((this->m_verifyTextureSampleBuffers & 1U) == 0)) {
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    uVar6 = (*pcVar2)(dVar5,"a_position");
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    iVar4 = (*pcVar2)(dVar5,"u_sampler");
    resultImage_2.m_pixels.m_cap._4_4_ = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      resultImage_2.m_pixels.m_cap._4_4_ = 0xde1;
    }
    tcu::Surface::Surface((Surface *)local_bf8,this->m_renderSize,this->m_renderSize);
    if (this->m_numRequestedSamples == 0) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_ef8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_ef8,
                           (char (*) [68])
                           "Drawing texture to single sample framebuffer. Using sampler shader.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ef8);
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_d78,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_d78,
                           (char (*) [85])
                           "Using sampler shader to sample the multisample texture to single sample framebuffer."
                          );
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d78);
    }
    if (iVar4 == -1) {
      local_f1a = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f18,"Location u_sampler was -1.",&local_f19);
      tcu::TestError::TestError(pTVar11,&local_f18);
      local_f1a = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x188))(0x4000);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1a00))(0,0,this->m_renderSize);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x23f);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(this->m_resolveVao);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x40))(0x8892,this->m_resolveBuffer);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x19f0))(uVar6,4,0x1406,0,0,0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x610))(uVar6);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"set attrib",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x245);
    (**(code **)(sectionDescription.field_2._8_8_ + 8))(0x84c0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xb8))
              (resultImage_2.m_pixels.m_cap._4_4_,this->m_fboTexture);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"bind tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x249);
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    (*pcVar2)(dVar5);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x14f0))(iVar4,0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x538))(5,0,4);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1680))(0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(0);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x253);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_10a0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_10a0,(char (*) [47])"Reading pixels from single sample framebuffer."
                        );
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_10a0);
    pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)&samplerLocation_1,(Surface *)local_bf8);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)&samplerLocation_1);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,600);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,(Surface *)local_bf8);
    tcu::Surface::~Surface((Surface *)local_bf8);
  }
  else if ((this->m_renderTarget == TARGET_TEXTURE) &&
          ((this->m_verifyTextureSampleBuffers & 1U) != 0)) {
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    uVar6 = (*pcVar2)(dVar5,"a_position");
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    iVar4 = (*pcVar2)(dVar5,"u_sampler");
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (*pcVar2)(dVar5,"u_sampleNdx");
    resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0xde1;
    }
    iVar1 = this->m_numTargetSamples;
    std::allocator<tcu::Surface>::allocator(&local_10f1);
    std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
              ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_10f0,(long)iVar1,
               &local_10f1);
    std::allocator<tcu::Surface>::~allocator(&local_10f1);
    if (this->m_numRequestedSamples == 0) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_13f8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<(&local_13f8,(char (*) [17])"Reading texture.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_13f8);
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1278,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_1278,(char (*) [44])"Reading multisample texture sample buffers.")
      ;
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1278);
    }
    if (iVar4 == -1) {
      local_141a = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1418,"Location u_sampler was -1.",&local_1419);
      tcu::TestError::TestError(pTVar11,&local_1418);
      local_141a = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
      local_1442 = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sampleNdx,"Location u_sampleNdx was -1.",&local_1441);
      tcu::TestError::TestError(pTVar11,(string *)&sampleNdx);
      local_1442 = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (local_1448 = 0; local_1448 < this->m_numTargetSamples; local_1448 = local_1448 + 1) {
      pvVar15 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                          ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_10f0,
                           (long)local_1448);
      tcu::Surface::setSize(pvVar15,this->m_renderSize,this->m_renderSize);
    }
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x188))(0x4000);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1a00))(0,0,this->m_renderSize);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x278);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(this->m_resolveVao);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x40))(0x8892,this->m_resolveBuffer);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x19f0))(uVar6,4,0x1406,0,0,0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x610))(uVar6);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"set attrib",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x27e);
    (**(code **)(sectionDescription.field_2._8_8_ + 8))(0x84c0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xb8))
              (resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._0_4_,this->m_fboTexture);
    dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
    glu::checkError(dVar5,"bind tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x282);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,this->m_resolveFbo);
    pcVar2 = *(code **)(sectionDescription.field_2._8_8_ + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram(this->m_textureSamplerProgram);
    (*pcVar2)(dVar5);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x14f0))(iVar4,0);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_15c8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_15c8,(char (*) [23])"Reading sample buffers");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_15c8);
    for (local_15cc = 0; local_15cc < this->m_numTargetSamples; local_15cc = local_15cc + 1) {
      (**(code **)(sectionDescription.field_2._8_8_ + 0x14f0))
                (resultBuffers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_15cc);
      (**(code **)(sectionDescription.field_2._8_8_ + 0x538))(5,0,4);
      dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
      glu::checkError(dVar5,"draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x28e);
      pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      pvVar15 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                          ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_10f0,
                           (long)local_15cc);
      tcu::Surface::getAccess(&local_15f8,pvVar15);
      glu::readPixels(pRVar7,0,0,&local_15f8);
      dVar5 = (**(code **)(sectionDescription.field_2._8_8_ + 0x800))();
      glu::checkError(dVar5,"read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x291);
    }
    (**(code **)(sectionDescription.field_2._8_8_ + 0x1680))(0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0xd8))(0);
    (**(code **)(sectionDescription.field_2._8_8_ + 0x78))(0x8d40,0);
    verifyResultBuffersAndSetResult
              (this,(vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_10f0);
    std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector
              ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_10f0);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_148);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MultisampleRenderCase::drawOneIteration (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const std::string			sectionDescription	= (m_numIterations > 1) ? ("Iteration " + de::toString(m_iteration+1) + "/" + de::toString(m_numIterations) + ": " + getIterationDescription(m_iteration)) : ("Test");
	const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration), sectionDescription);

	// Per iteration shader?
	if (m_perIterationShader)
	{
		delete m_program;
		m_program = DE_NULL;

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(genVertexSource(m_numTargetSamples))
			<< glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}

	// render
	{
		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
		{
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind fbo");

			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to fbo." << tcu::TestLog::EndMessage;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to default framebuffer." << tcu::TestLog::EndMessage;

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		gl.bindVertexArray(m_renderVao);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);

		// set attribs
		DE_ASSERT(!m_renderAttribs.empty());
		for (std::map<std::string, Attrib>::const_iterator it = m_renderAttribs.begin(); it != m_renderAttribs.end(); ++it)
		{
			const deInt32 location = gl.getAttribLocation(m_program->getProgram(), it->first.c_str());

			if (location != -1)
			{
				gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, it->second.stride, (deUint8*)DE_NULL + it->second.offset);
				gl.enableVertexAttribArray(location);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

		gl.useProgram(m_program->getProgram());
		preDraw();
		gl.drawArrays(m_renderMode, 0, m_renderCount);
		postDraw();
		gl.useProgram(0);
		gl.bindVertexArray(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	// read
	{
		if (m_renderTarget == TARGET_DEFAULT)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from default framebuffer." << tcu::TestLog::EndMessage;

			// default directly
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			// rbo by blitting to non-multisample fbo

			m_testCtx.getLog() << tcu::TestLog::Message << "Blitting result from fbo to single sample fbo. (Resolve multisample)" << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo);
			gl.blitFramebuffer(0, 0, m_renderSize, m_renderSize, 0, 0, m_renderSize, m_renderSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "blit resolve");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo);
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && !m_verifyTextureSampleBuffers)
		{
			const deInt32	posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32	samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deUint32	textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			tcu::Surface	resultImage		(m_renderSize, m_renderSize);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Using sampler shader to sample the multisample texture to single sample framebuffer." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Drawing texture to single sample framebuffer. Using sampler shader." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");

			// resolve multisample texture by averaging
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

			gl.useProgram(0);
			gl.bindVertexArray(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && m_verifyTextureSampleBuffers)
		{
			const deInt32				posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32				samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deInt32				sampleLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampleNdx");
			const deUint32				textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			std::vector<tcu::Surface>	resultBuffers	(m_numTargetSamples);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading multisample texture sample buffers." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading texture." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");
			if (sampleLocation == -1)
				throw tcu::TestError("Location u_sampleNdx was -1.");

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
				resultBuffers[sampleNdx].setSize(m_renderSize, m_renderSize);

			// read sample buffers to different surfaces
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading sample buffers" << tcu::TestLog::EndMessage;

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
			{
				gl.uniform1i(sampleLocation, sampleNdx);
				gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

				glu::readPixels(m_context.getRenderContext(), 0, 0, resultBuffers[sampleNdx].getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");
			}

			gl.useProgram(0);
			gl.bindVertexArray(0);
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// verify sample buffers
			verifyResultBuffersAndSetResult(resultBuffers);
		}
		else
			DE_ASSERT(false);
	}
}